

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O2

void mapDraw(vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *obstalces,Obstacle *obst,Mat *src)

{
  pointer pvVar1;
  pointer pPVar2;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  Point *pt;
  pointer pPVar6;
  size_t i;
  ulong in_stack_ffffffffffffff08;
  undefined4 local_e0 [2];
  Mat *local_d8;
  undefined8 local_d0;
  Matx<double,_4,_1> local_c8;
  undefined4 local_a0 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_98;
  undefined8 local_90;
  double local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_70;
  Obstacle *local_68;
  Point_<int> local_60;
  Point_<int> local_58;
  Point_<int> local_50;
  Point_<int> local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  uVar5 = 0;
  local_70 = obstalces;
  local_68 = obst;
  while (pvVar3 = local_70,
        uVar5 < (ulong)(((long)(local_70->
                               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_70->
                              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    local_d0 = 0;
    local_90 = 0;
    local_e0[0] = 0x3010000;
    local_a0[0] = 0x8104000c;
    local_d8 = src;
    local_98 = local_70;
    cv::Matx<double,_4,_1>::Matx(&local_c8);
    local_c8.val[0] = 80.0;
    local_c8.val[1] = 80.0;
    local_c8.val[2] = 80.0;
    local_c8.val[3] = 0.0;
    uVar4 = cv::noArray();
    local_38 = 0;
    cv::drawContours(local_e0,local_a0,uVar5 & 0xffffffff,&local_c8,0xffffffffffffffff,8,uVar4,
                     0x7fffffff,&local_38);
    local_d0 = 0;
    local_90 = 0;
    local_e0[0] = 0x3010000;
    local_a0[0] = 0x8104000c;
    local_d8 = src;
    local_98 = pvVar3;
    cv::Matx<double,_4,_1>::Matx(&local_c8);
    local_c8.val[0] = 255.0;
    local_c8.val[1] = 0.0;
    local_c8.val[2] = 0.0;
    local_c8.val[3] = 0.0;
    in_stack_ffffffffffffff08 = cv::noArray();
    local_40 = 0;
    cv::drawContours(local_e0,local_a0,uVar5 & 0xffffffff,&local_c8,3,8,in_stack_ffffffffffffff08,
                     0x7fffffff,&local_40);
    pvVar1 = (pvVar3->
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = *(pointer *)
              ((long)&pvVar1[uVar5].
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data + 8);
    local_88 = (double)uVar5;
    for (pPVar6 = pvVar1[uVar5].
                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_start; pPVar6 != pPVar2; pPVar6 = pPVar6 + 1) {
      local_d0 = 0;
      local_e0[0] = 0x3010000;
      local_48 = *pPVar6;
      local_d8 = src;
      cv::Matx<double,_4,_1>::Matx(&local_c8);
      local_c8.val[2] = 0.0;
      local_c8.val[3] = 0.0;
      local_c8.val[0] = 0.0;
      local_c8.val[1] = 0.0;
      in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 & 0xffffffff00000000;
      cv::circle(local_e0,&local_48,2,&local_c8,0xffffffffffffffff,8,in_stack_ffffffffffffff08);
    }
    uVar5 = (long)local_88 + 1;
  }
  uVar5 = 1;
  local_88 = 0.0;
  uStack_80 = 0;
  uStack_7c = 0x406fe000;
  while( true ) {
    pPVar6 = (local_68->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (local_68->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pPVar2 - (long)pPVar6 >> 3) <= uVar5) break;
    local_d0 = 0;
    local_e0[0] = 0x3010000;
    local_50 = pPVar6[uVar5 - 1];
    local_58 = pPVar6[uVar5];
    local_d8 = src;
    cv::Matx<double,_4,_1>::Matx(&local_c8);
    local_c8.val[1] = (double)CONCAT44(uStack_7c,uStack_80);
    local_c8.val[0] = local_88;
    local_c8.val[2] = 0.0;
    local_c8.val[3] = 0.0;
    in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 & 0xffffffff00000000;
    cv::line(local_e0,&local_50,&local_58,&local_c8,3,8,in_stack_ffffffffffffff08);
    uVar5 = uVar5 + 1;
  }
  for (; pPVar6 != pPVar2; pPVar6 = pPVar6 + 1) {
    local_d0 = 0;
    local_e0[0] = 0x3010000;
    local_60 = *pPVar6;
    local_d8 = src;
    cv::Matx<double,_4,_1>::Matx(&local_c8);
    local_c8.val[2] = 0.0;
    local_c8.val[3] = 0.0;
    local_c8.val[0] = 0.0;
    local_c8.val[1] = 0.0;
    in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 & 0xffffffff00000000;
    cv::circle(local_e0,&local_60,2,&local_c8,0xffffffff,8,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void mapDraw(const std::vector<Obstacle>& obstalces, const Obstacle& obst, cv::Mat& src) {
    for (size_t i = 0; i <  obstalces.size(); i++) {
        cv::drawContours(src, obstalces, i, cv::Scalar(80, 80, 80), -1);
        cv::drawContours(src, obstalces, i, cv::Scalar(255, 0, 0), 3);
        for (const cv::Point& pt: obstalces[i]) {
            cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
        }
    }
    for (size_t i = 1; i < obst.size(); i++) {
        cv::line(src, obst[i - 1], obst[i], cv::Scalar(0, 255, 0), 3);
    }
    for (const cv::Point& pt: obst) {
        cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
    }
}